

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * mg_get_option(mg_context *ctx,char *name)

{
  int iVar1;
  char *__s1;
  long lVar2;
  mg_option *pmVar3;
  
  __s1 = "listening_ports";
  lVar2 = 0x5076;
  pmVar3 = config_options;
  while( true ) {
    pmVar3 = pmVar3 + 1;
    iVar1 = strcmp(__s1,name);
    if (iVar1 == 0) break;
    __s1 = pmVar3->name;
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x50b0) {
      return (char *)0x0;
    }
  }
  if (ctx == (mg_context *)0x0) {
    return "";
  }
  if (*(char **)(&ctx->context_type + lVar2 * 2) == (char *)0x0) {
    return "";
  }
  return *(char **)(&ctx->context_type + lVar2 * 2);
}

Assistant:

CIVETWEB_API const char *
mg_get_option(const struct mg_context *ctx, const char *name)
{
	int i;
	if ((i = get_option_index(name)) == -1) {
		return NULL;
	} else if (!ctx || ctx->dd.config[i] == NULL) {
		return "";
	} else {
		return ctx->dd.config[i];
	}
}